

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint ON_SubDEdgeChain::SortEdgesIntoEdgeChains
               (ON_SubD *subd,ON_SimpleArray<ON_COMPONENT_INDEX> *unsorted_edges,
               ON_SimpleArray<ON_SubDEdgePtr> *sorted_edges)

{
  element_type *peVar1;
  uint uVar2;
  uint i;
  ulong uVar3;
  ulong new_capacity;
  ON_SubDEdge *e;
  ON_SimpleArray<const_ON_SubDEdge_*> local_unsorted_edges;
  ON_SubDEdge *local_50;
  ON_SimpleArray<const_ON_SubDEdge_*> local_48;
  
  new_capacity = (ulong)(uint)unsorted_edges->m_count;
  local_48._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00828e30;
  local_48.m_a = (ON_SubDEdge **)0x0;
  local_48.m_count = 0;
  local_48.m_capacity = 0;
  if (new_capacity != 0) {
    ON_SimpleArray<const_ON_SubDEdge_*>::SetCapacity(&local_48,new_capacity);
    uVar3 = 0;
    do {
      if ((unsorted_edges->m_a[uVar3].m_type == subd_edge) &&
         (uVar2 = unsorted_edges->m_a[uVar3].m_index, 1 < uVar2 + 1)) {
        peVar1 = (subd->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        if (peVar1 == (element_type *)0x0) {
          local_50 = (ON_SubDEdge *)0x0;
        }
        else {
          local_50 = ON_SubDHeap::EdgeFromId(&peVar1->m_heap,uVar2);
        }
        if (local_50 != (ON_SubDEdge *)0x0) {
          ON_SimpleArray<const_ON_SubDEdge_*>::Append(&local_48,&local_50);
        }
      }
      uVar3 = uVar3 + 1;
    } while (new_capacity != uVar3);
  }
  uVar2 = Internal_MuchImprovedSortEdgesIntoChains
                    ((ON__UINT_PTR *)local_48.m_a,(ulong)(uint)unsorted_edges->m_count,sorted_edges)
  ;
  ON_SimpleArray<const_ON_SubDEdge_*>::~ON_SimpleArray(&local_48);
  return uVar2;
}

Assistant:

unsigned int ON_SubDEdgeChain::SortEdgesIntoEdgeChains(
  const ON_SubD& subd,
  const ON_SimpleArray< ON_COMPONENT_INDEX >& unsorted_edges,
  ON_SimpleArray< ON_SubDEdgePtr >& sorted_edges
)
{
  const unsigned unsorted_count = unsorted_edges.UnsignedCount();
  ON_SimpleArray< const ON_SubDEdge* > local_unsorted_edges(unsorted_count);
  for (unsigned i = 0; i < unsorted_count; ++i)
  {
    const ON_COMPONENT_INDEX ci = unsorted_edges[i];
    if (ON_COMPONENT_INDEX::TYPE::subd_edge != ci.m_type)
      continue;
    if (0 == ci.m_index || -1 == ci.m_index)
      continue;
    const ON_SubDEdge* e = subd.EdgeFromId((unsigned)ci.m_index);
    if (nullptr == e)
      continue;
    local_unsorted_edges.Append(e);
  }

  return Internal_MuchImprovedSortEdgesIntoChains(
    (const ON__UINT_PTR*)local_unsorted_edges.Array(),
    unsorted_edges.UnsignedCount(),
    sorted_edges
  );
}